

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler_unittest.cc
# Opt level: O0

void anon_unknown.dwarf_3c85::do_free(void *p)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> l;
  void *p_local;
  
  l._M_device = (mutex_type *)p;
  std::lock_guard<std::mutex>::lock_guard
            (&local_18,(mutex_type *)(anonymous_namespace)::allocate_lock);
  std::__atomic_base<long>::operator++((__atomic_base<long> *)&(anonymous_namespace)::free_count,0);
  free(l._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void do_free(void* p) {
  std::lock_guard l{allocate_lock};

  free_count++;
  free(p);
}